

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O2

void __thiscall
pegmatite::AsciiFileInput::AsciiFileInput(AsciiFileInput *this,int file,string *name)

{
  int iVar1;
  stat buf;
  stat local_a0;
  
  Input::Input(&this->super_Input,name);
  (this->super_Input)._vptr_Input = (_func_int **)&PTR_fillBuffer_00165b30;
  this->fd = file;
  iVar1 = fstat(file,&local_a0);
  if (iVar1 == 0) {
    this->file_size = local_a0.st_size;
    return;
  }
  this->file_size = 0;
  perror("Input error");
  return;
}

Assistant:

AsciiFileInput::AsciiFileInput(int file, const std::string& name)
	: Input(name), fd(file)
{
	struct stat buf;
	if (fstat(fd, &buf) != 0)
	{
		file_size = 0;
		perror("Input error");
	}
	else
	{
		file_size = static_cast<Index>(buf.st_size);
	}
}